

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

XmlWriter * __thiscall Catch::XmlWriter::writeAttribute(XmlWriter *this,string *name,bool attribute)

{
  ostream *poVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  char local_1a [2];
  
  local_1a[0] = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(this->m_os,local_1a,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=\"",2);
  pcVar2 = "false";
  if ((int)CONCAT71(in_register_00000011,attribute) != 0) {
    pcVar2 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,pcVar2,CONCAT71(in_register_00000011,attribute) & 0xffffffff ^ 5);
  local_1a[1] = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1a + 1,1);
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeAttribute( std::string const& name, bool attribute ) {
        m_os << ' ' << name << "=\"" << ( attribute ? "true" : "false" ) << '"';
        return *this;
    }